

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O2

_Bool Hacl_Bignum64_mod(uint32_t len,uint64_t *n,uint64_t *a,uint64_t *res)

{
  size_t sVar1;
  uint64_t b;
  long lVar2;
  uint64_t *puVar3;
  uint64_t *b_00;
  uint64_t *res_00;
  uint32_t len_00;
  uint64_t uVar4;
  uint64_t uVar5;
  void *__s;
  uint64_t *res_01;
  _Bool _Var6;
  ulong uVar7;
  uint32_t i;
  ulong uVar8;
  uint64_t uStack_80;
  void *local_78;
  uint64_t local_70;
  uint64_t *local_68;
  ulong local_60;
  uint64_t *local_58;
  uint64_t *local_50;
  size_t local_48;
  uint32_t local_3c;
  void *local_38;
  
  local_38 = (void *)(ulong)len;
  uVar7 = (long)local_38 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar2 = -uVar7;
  __s = (void *)((long)&local_78 + lVar2);
  sVar1 = (long)local_38 * 8;
  local_78 = __s;
  local_68 = a;
  local_60 = uVar7;
  local_50 = res;
  local_48 = sVar1;
  local_3c = len;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x17b82d;
  memset(__s,0,sVar1);
  *(undefined8 *)((long)&local_78 - uVar7) = 1;
  local_70 = *n;
  uVar7 = 0;
  local_58 = n;
  for (uVar8 = 0; len_00 = local_3c, b_00 = local_58, local_38 != (void *)uVar8; uVar8 = uVar8 + 1)
  {
    uVar5 = *(uint64_t *)((long)local_78 + uVar8 * 8);
    b = local_58[uVar8];
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x17b865;
    uVar4 = FStar_UInt64_eq_mask(uVar5,b);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x17b873;
    uVar5 = FStar_UInt64_gte_mask(uVar5,b);
    uVar7 = uVar7 & uVar4 | ~(uVar5 | uVar4);
  }
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x17b897;
  uVar5 = Hacl_Bignum_Lib_bn_get_top_index_u64(len_00,b_00);
  sVar1 = local_48;
  puVar3 = local_50;
  _Var6 = (_Bool)(uVar7 == 0xffffffffffffffff & (byte)local_70);
  if (_Var6 == false) {
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x17b90e;
    memset(puVar3,0,sVar1);
  }
  else {
    res_01 = (uint64_t *)((long)__s - local_60);
    local_38 = __s;
    res_01[-1] = 0x17b8c7;
    memset(res_01,0,sVar1);
    res_01[-1] = 0x17b8d7;
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len_00,(int)uVar5 << 6,b_00,res_01);
    uVar5 = *b_00;
    res_01[-1] = 0x17b8e0;
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar5);
    res_00 = local_50;
    puVar3 = local_68;
    res_01[-1] = 0x17b8f9;
    bn_slow_precomp(len_00,b_00,uVar5,res_01,puVar3,res_00);
  }
  return _Var6;
}

Assistant:

bool Hacl_Bignum64_mod(uint32_t len, uint64_t *n, uint64_t *a, uint64_t *res)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t one[len];
  memset(one, 0U, len * sizeof (uint64_t));
  memset(one, 0U, len * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(len, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t r2[len];
    memset(r2, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len, nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(len, n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, len * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}